

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

string * __thiscall
program_options::error_with_option_name::get_canonical_option_prefix_abi_cxx11_
          (error_with_option_name *this)

{
  logic_error *this_00;
  long in_RSI;
  string *in_RDI;
  string *psVar1;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11 [17];
  
  iVar2 = *(int *)(in_RSI + 0x10);
  psVar1 = in_RDI;
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_28);
  }
  else if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_27);
  }
  else if (iVar2 == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_11);
  }
  else if (iVar2 == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    if (iVar2 != 0x1000) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "error_with_option_name::m_option_style can only be one of [0, allow_dash_for_short, allow_slash_for_short, allow_long_disguise or allow_long]"
                );
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_26);
  }
  return psVar1;
}

Assistant:

std::string error_with_option_name::get_canonical_option_prefix() const
{
    switch (m_option_style)
    {
    case command_line_style::allow_dash_for_short:
        return "-";
    case command_line_style::allow_slash_for_short:
        return "/";
    case command_line_style::allow_long_disguise:
        return "-";
    case command_line_style::allow_long:
        return "--";
    case 0:
        return "";
    }
    throw std::logic_error("error_with_option_name::m_option_style can only be "
                           "one of [0, allow_dash_for_short, allow_slash_for_short, "
                           "allow_long_disguise or allow_long]");
}